

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

QSize __thiscall QMdi::ControllerWidget::sizeHint(ControllerWidget *this)

{
  long lVar1;
  QStyle *pQVar2;
  QSize QVar3;
  long in_FS_OFFSET;
  int local_70;
  int local_6c;
  QStyleOptionComplex opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished(&this->super_QWidget);
  opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex(&opt,1,0xf0000);
  initStyleOption(this,&opt);
  pQVar2 = QWidget::style(&this->super_QWidget);
  local_6c = (**(code **)(*(long *)pQVar2 + 0xe0))(pQVar2,0x5c,&opt,this);
  local_70 = local_6c * 3;
  pQVar2 = QWidget::style(&this->super_QWidget);
  QVar3 = (QSize)(**(code **)(*(long *)pQVar2 + 0xe8))(pQVar2,0x15,&opt,&local_70,this);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QSize ControllerWidget::sizeHint() const
{
    ensurePolished();
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    const int buttonSize = style()->pixelMetric(QStyle::PM_TitleBarButtonSize, &opt, this);
    QSize size(3 * buttonSize, buttonSize);
    return style()->sizeFromContents(QStyle::CT_MdiControls, &opt, size, this);
}